

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

MOJOSHADER_parseData *
MOJOSHADER_parse(char *profile,char *mainfn,uchar *tokenbuf,uint bufsize,MOJOSHADER_swizzle *swiz,
                uint swizcount,MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                MOJOSHADER_free f,void *d)

{
  int iVar1;
  uint uVar2;
  Context *ctx_00;
  char *pcVar3;
  int local_68;
  int failed;
  int rc;
  Context *ctx;
  MOJOSHADER_parseData *retval;
  uint swizcount_local;
  MOJOSHADER_swizzle *swiz_local;
  uint bufsize_local;
  uchar *tokenbuf_local;
  char *mainfn_local;
  char *profile_local;
  
  local_68 = 0;
  if (((m == (MOJOSHADER_malloc)0x0) && (f != (MOJOSHADER_free)0x0)) ||
     ((m != (MOJOSHADER_malloc)0x0 && (f == (MOJOSHADER_free)0x0)))) {
    profile_local = (char *)&MOJOSHADER_out_of_mem_data;
  }
  else {
    ctx_00 = build_context(profile,mainfn,tokenbuf,bufsize,swiz,swizcount,smap,smapcount,m,f,d);
    if (ctx_00 == (Context *)0x0) {
      profile_local = (char *)&MOJOSHADER_out_of_mem_data;
    }
    else {
      if (profile == (char *)0x0) {
        fail(ctx_00,"Profile name is NULL");
      }
      iVar1 = isfail(ctx_00);
      if (iVar1 == 0) {
        verify_swizzles(ctx_00);
        ctx_00->current_position = 0;
        uVar2 = parse_version_token(ctx_00,profile);
        if (ctx_00->mainfn == (char *)0x0) {
          pcVar3 = StrDup(ctx_00,"main");
          ctx_00->mainfn = pcVar3;
        }
        if ((int)uVar2 < 0) {
          profile_local = (char *)build_parsedata(ctx_00);
          destroy_context(ctx_00);
        }
        else {
          if (ctx_00->tokencount < uVar2) {
            fail(ctx_00,"Corrupted or truncated shader");
            ctx_00->tokencount = uVar2;
          }
          adjust_token_position(ctx_00,uVar2);
          while (ctx_00->tokencount != 0) {
            if (ctx_00->know_shader_size == 0) {
              ctx_00->tokencount = 0xffffffff;
            }
            iVar1 = isfail(ctx_00);
            if (iVar1 != 0) {
              local_68 = 1;
              ctx_00->isfail = 0;
            }
            uVar2 = parse_token(ctx_00);
            if (ctx_00->tokencount < uVar2) {
              fail(ctx_00,"Corrupted or truncated shader");
              break;
            }
            adjust_token_position(ctx_00,uVar2);
          }
          ctx_00->current_position = -1;
          iVar1 = shader_is_pixel(ctx_00);
          if (((iVar1 != 0) && (iVar1 = shader_version_atleast(ctx_00,'\x02','\0'), iVar1 == 0)) &&
             (iVar1 = register_was_written(ctx_00,REG_TYPE_TEMP,0), iVar1 == 0)) {
            fail(ctx_00,"r0 (pixel shader 1.x color output) never written to");
          }
          if (local_68 == 0) {
            process_definitions(ctx_00);
            local_68 = isfail(ctx_00);
          }
          if (local_68 == 0) {
            (*ctx_00->profile->finalize_emitter)(ctx_00);
          }
          ctx_00->isfail = local_68;
          profile_local = (char *)build_parsedata(ctx_00);
          destroy_context(ctx_00);
        }
      }
      else {
        profile_local = (char *)build_parsedata(ctx_00);
        destroy_context(ctx_00);
      }
    }
  }
  return (MOJOSHADER_parseData *)profile_local;
}

Assistant:

const MOJOSHADER_parseData *MOJOSHADER_parse(const char *profile,
                                             const char *mainfn,
                                             const unsigned char *tokenbuf,
                                             const unsigned int bufsize,
                                             const MOJOSHADER_swizzle *swiz,
                                             const unsigned int swizcount,
                                             const MOJOSHADER_samplerMap *smap,
                                             const unsigned int smapcount,
                                             MOJOSHADER_malloc m,
                                             MOJOSHADER_free f, void *d)
{
    MOJOSHADER_parseData *retval = NULL;
    Context *ctx = NULL;
    int rc = 0;
    int failed = 0;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_data;  // supply both or neither.

    ctx = build_context(profile, mainfn, tokenbuf, bufsize, swiz, swizcount,
                        smap, smapcount, m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_data;

    if (profile == NULL)  // build_context allows NULL; check this ourselves.
        fail(ctx, "Profile name is NULL");

    if (isfail(ctx))
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    verify_swizzles(ctx);

    // Version token always comes first.
    ctx->current_position = 0;
    rc = parse_version_token(ctx, profile);

    if (!ctx->mainfn)
        ctx->mainfn = StrDup(ctx, "main");

    // drop out now if this definitely isn't bytecode. Saves lots of
    //  meaningless errors flooding through.
    if (rc < 0)
    {
        retval = build_parsedata(ctx);
        destroy_context(ctx);
        return retval;
    } // if

    if ( ((uint32) rc) > ctx->tokencount )
    {
        fail(ctx, "Corrupted or truncated shader");
        ctx->tokencount = rc;
    } // if

    adjust_token_position(ctx, rc);

    // parse out the rest of the tokens after the version token...
    while (ctx->tokencount > 0)
    {
        if (!ctx->know_shader_size)
            ctx->tokencount = 0xFFFFFFFF;  // keep this value obscenely large.

        // reset for each token.
        if (isfail(ctx))
        {
            failed = 1;
            ctx->isfail = 0;
        } // if

        rc = parse_token(ctx);
        if ( ((uint32) rc) > ctx->tokencount )
        {
            fail(ctx, "Corrupted or truncated shader");
            break;
        } // if

        adjust_token_position(ctx, rc);
    } // while

    ctx->current_position = MOJOSHADER_POSITION_AFTER;

    // for ps_1_*, the output color is written to r0...throw an
    //  error if this register was never written. This isn't
    //  important for vertex shaders, or shader model 2+.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        if (!register_was_written(ctx, REG_TYPE_TEMP, 0))
            fail(ctx, "r0 (pixel shader 1.x color output) never written to");
    } // if

    if (!failed)
    {
        process_definitions(ctx);
        failed = isfail(ctx);
    } // if

    if (!failed)
        ctx->profile->finalize_emitter(ctx);

    ctx->isfail = failed;
    retval = build_parsedata(ctx);
    destroy_context(ctx);
    return retval;
}